

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_36::HttpFixedLengthEntityWriter::write
          (HttpFixedLengthEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  Coroutine<void> *this_00;
  PromiseAwaiter<void> *__return_storage_ptr__;
  ulong *puVar1;
  HttpOutputStream *this_01;
  ulong uVar2;
  HttpEntityBodyWriter *this_02;
  PromiseArenaMember *node;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> coroutine;
  ulong uVar4;
  undefined4 in_register_00000034;
  long lVar5;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  Fault f;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  Fault local_78;
  DebugComparison<unsigned_long_&,_unsigned_long_&> local_70;
  FixVoid<void> *local_48;
  long local_40;
  HttpFixedLengthEntityWriter *local_38;
  
  coroutine._M_fr_ptr = operator_new(0x410);
  *(code **)coroutine._M_fr_ptr = write;
  *(code **)((long)coroutine._M_fr_ptr + 8) = write;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(long *)((long)coroutine._M_fr_ptr + 0x400) = CONCAT44(in_register_00000034,__fd);
  local_70.left = (unsigned_long *)0x4f0126;
  local_70.right = (unsigned_long *)0x4d1c4f;
  local_70.op.content.ptr = (char *)0x11000009b1;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00609238;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00609280;
  location.function = "write";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x9b1;
  location.columnNumber = 0x11;
  local_40 = CONCAT44(in_register_00000034,__fd);
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00609238;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00609280;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpEntityBodyWriter).super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)this_00;
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x3f0) = 0;
  local_38 = this;
  if (__n != 0) {
    __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
    puVar1 = (ulong *)((long)coroutine._M_fr_ptr + 0x3f0);
    this_01 = (HttpOutputStream *)((long)coroutine._M_fr_ptr + 0x3f8);
    local_48 = (FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x409);
    lVar5 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + *(long *)((long)__buf + lVar5 + 8);
      lVar5 = lVar5 + 0x10;
    } while (__n << 4 != lVar5);
    *puVar1 = uVar4;
    if (uVar4 != 0) {
      local_70.right = (unsigned_long *)(local_40 + 0x18);
      uVar2 = *(ulong *)(local_40 + 0x18);
      local_70.op.content.ptr = " <= ";
      local_70.op.content.size_ = 5;
      local_70.result = uVar2 >= uVar4;
      local_70.left = puVar1;
      if (uVar2 < uVar4) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[25]>
                  (&local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x9b6,FAILED,"size <= length","_kjCondition,\"overwrote Content-Length\"",
                   &local_70,(char (*) [25])"overwrote Content-Length");
        kj::_::Debug::Fault::fatal(&local_78);
      }
      *(ulong *)(local_40 + 0x18) = uVar2 - uVar4;
      this_02 = *(HttpEntityBodyWriter **)(local_40 + 8);
      HttpEntityBodyWriter::getInner(this_02);
      pieces.size_ = (size_t)__buf;
      pieces.ptr = (ArrayPtr<const_unsigned_char> *)this_02;
      HttpOutputStream::writeBodyData(this_01,pieces);
      co_await<void>(__return_storage_ptr__,(Promise<void> *)this_01);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x408) = 0;
      bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
      if (bVar3) {
        return (ssize_t)local_38;
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
      node = (PromiseArenaMember *)
             (this_01->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
             currentWrapper.ptr;
      if (node != (PromiseArenaMember *)0x0) {
        (this_01->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
        currentWrapper.ptr = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
        kj::_::PromiseDisposer::dispose(node);
      }
      if ((*(HttpEntityBodyWriter **)((long)coroutine._M_fr_ptr + 0x400))[1].super_AsyncOutputStream
          ._vptr_AsyncOutputStream == (_func_int **)0x0) {
        HttpEntityBodyWriter::doneWriting
                  (*(HttpEntityBodyWriter **)((long)coroutine._M_fr_ptr + 0x400));
      }
      kj::_::Coroutine<void>::fulfill(this_00,local_48);
      goto LAB_00399d91;
    }
  }
  kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x40a));
LAB_00399d91:
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x408) = 1;
  return (ssize_t)local_38;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    uint64_t size = 0;
    for (auto& piece: pieces) size += piece.size();

    if (size == 0) co_return;
    KJ_REQUIRE(size <= length, "overwrote Content-Length");
    length -= size;

    co_await getInner().writeBodyData(pieces);
    if (length == 0) doneWriting();
  }